

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  Cord *this_00;
  bool bVar1;
  uint32_t number;
  CppStringType CVar2;
  FieldDescriptor *pFVar3;
  ulong uVar4;
  uint32_t *puVar5;
  Cord **ppCVar6;
  Message **ppMVar7;
  ArenaStringPtr *this_01;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (bVar1) {
    pFVar3 = OneofDescriptor::field(oneof_descriptor,0);
    ClearField(this,message,pFVar3);
    return;
  }
  number = GetOneofCase(this,message,oneof_descriptor);
  if (number != 0) {
    pFVar3 = Descriptor::FindFieldByNumber(this->descriptor_,number);
    uVar4 = (message->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar4 & 1) != 0) {
      uVar4 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
    }
    if (uVar4 == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar3->type_ * 4) == 10) {
        ppMVar7 = MutableRaw<google::protobuf::Message*>(this,message,pFVar3);
        if (*ppMVar7 != (Message *)0x0) {
          (*((*ppMVar7)->super_MessageLite)._vptr_MessageLite[1])();
        }
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar3->type_ * 4) == 9) {
        CVar2 = FieldDescriptor::cpp_string_type(pFVar3);
        if ((CVar2 == kView) || (CVar2 == kString)) {
          this_01 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,pFVar3);
          internal::ArenaStringPtr::Destroy(this_01);
        }
        else if (CVar2 == kCord) {
          ppCVar6 = MutableRaw<absl::lts_20250127::Cord*>(this,message,pFVar3);
          this_00 = *ppCVar6;
          if (this_00 != (Cord *)0x0) {
            absl::lts_20250127::Cord::~Cord(this_00);
          }
          operator_delete(this_00,0x10);
        }
      }
    }
    puVar5 = MutableOneofCase(this,message,oneof_descriptor);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    ClearField(message, oneof_descriptor->field(0));
    return;
  }
  // TODO: Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32_t oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (message->GetArena() == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              delete *MutableRaw<absl::Cord*>(message, field);
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsMicroString(field)) {
                MutableField<MicroString>(message, field)->Destroy();
              } else {
                // Oneof string fields are never set as a default instance.
                // We just need to pass some arbitrary default string to make it
                // work. This allows us to not have the real default accessible
                // from reflection.
                MutableField<ArenaStringPtr>(message, field)->Destroy();
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}